

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_manager.cc
# Opt level: O0

void __thiscall xsettingsd::SettingsManager::DestroyWindows(SettingsManager *this)

{
  Display *pDVar1;
  bool bVar2;
  reference puVar3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_20;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_18;
  iterator it;
  SettingsManager *this_local;
  
  it._M_current = (unsigned_long *)this;
  if (this->display_ != (Display *)0x0) {
    local_18._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->windows_);
    while( true ) {
      local_20._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->windows_);
      bVar2 = __gnu_cxx::operator!=(&local_18,&local_20);
      if (!bVar2) break;
      pDVar1 = this->display_;
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_18);
      XDestroyWindow(pDVar1,*puVar3);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_18);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->windows_);
    return;
  }
  __assert_fail("display_",
                "/workspace/llm4binary/github/license_c_cmakelists/derat[P]xsettingsd/settings_manager.cc"
                ,0xaa,"void xsettingsd::SettingsManager::DestroyWindows()");
}

Assistant:

void SettingsManager::DestroyWindows() {
  assert(display_);
  for (vector<Window>::iterator it = windows_.begin();
       it != windows_.end(); ++it) {
    XDestroyWindow(display_, *it);
  }
  windows_.clear();
}